

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<char> * __thiscall cimg_library::CImg<char>::_system_strescape(CImg<char> *this)

{
  byte bVar1;
  CImgList<char> *pCVar2;
  CImg<char> *pCVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  byte *values;
  long lVar7;
  byte *pbVar8;
  int iVar9;
  CImgList<char> list;
  CImg<char> local_68;
  CImgList<char> local_48;
  CImg<char> *local_38;
  
  local_48._width = 0;
  local_48._allocated_width = 0;
  local_48._data = (CImg<char> *)0x0;
  pbVar4 = (byte *)this->_data;
  lVar7 = (ulong)this->_spectrum * (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
  values = pbVar4;
  if (0 < lVar7) {
    pbVar8 = pbVar4 + lVar7;
    uVar5 = (ulong)pbVar4 & 0xffffffff;
    local_38 = this;
    do {
      bVar1 = *pbVar4;
      iVar9 = (int)uVar5;
      iVar6 = (int)values;
      if (bVar1 < 0x24) {
        if (bVar1 == 0x21) {
          if (pbVar4 != values) {
            CImg(&local_68,(char *)values,iVar9 - iVar6,1,1,1,false);
            uVar5 = local_48._0_8_ & 0xffffffff;
            pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
            move_to(&local_68,pCVar2->_data + uVar5);
            if ((local_68._is_shared == false) && (local_68._data != (char *)0x0)) {
              operator_delete__(local_68._data);
            }
          }
          CImg(&local_68,"\"\\!\"",4,1,1,1,false);
          uVar5 = local_48._0_8_ & 0xffffffff;
          pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
          move_to(&local_68,pCVar2->_data + uVar5);
          goto LAB_001a238b;
        }
        if (bVar1 == 0x22) {
          if (pbVar4 != values) {
            CImg(&local_68,(char *)values,iVar9 - iVar6,1,1,1,false);
            uVar5 = local_48._0_8_ & 0xffffffff;
            pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
            move_to(&local_68,pCVar2->_data + uVar5);
            if ((local_68._is_shared == false) && (local_68._data != (char *)0x0)) {
              operator_delete__(local_68._data);
            }
          }
          CImg(&local_68,"\\\"",2,1,1,1,false);
          uVar5 = local_48._0_8_ & 0xffffffff;
          pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
          move_to(&local_68,pCVar2->_data + uVar5);
          goto LAB_001a238b;
        }
      }
      else {
        if (bVar1 == 0x24) {
          if (pbVar4 != values) {
            CImg(&local_68,(char *)values,iVar9 - iVar6,1,1,1,false);
            uVar5 = local_48._0_8_ & 0xffffffff;
            pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
            move_to(&local_68,pCVar2->_data + uVar5);
            if ((local_68._is_shared == false) && (local_68._data != (char *)0x0)) {
              operator_delete__(local_68._data);
            }
          }
          CImg(&local_68,"\\$",2,1,1,1,false);
          uVar5 = local_48._0_8_ & 0xffffffff;
          pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
          move_to(&local_68,pCVar2->_data + uVar5);
        }
        else if (bVar1 == 0x60) {
          if (pbVar4 != values) {
            CImg(&local_68,(char *)values,iVar9 - iVar6,1,1,1,false);
            uVar5 = local_48._0_8_ & 0xffffffff;
            pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
            move_to(&local_68,pCVar2->_data + uVar5);
            if ((local_68._is_shared == false) && (local_68._data != (char *)0x0)) {
              operator_delete__(local_68._data);
            }
          }
          CImg(&local_68,"\\`",2,1,1,1,false);
          uVar5 = local_48._0_8_ & 0xffffffff;
          pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
          move_to(&local_68,pCVar2->_data + uVar5);
        }
        else {
          if (bVar1 != 0x5c) goto LAB_001a23a5;
          if (pbVar4 != values) {
            CImg(&local_68,(char *)values,iVar9 - iVar6,1,1,1,false);
            uVar5 = local_48._0_8_ & 0xffffffff;
            pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
            move_to(&local_68,pCVar2->_data + uVar5);
            if ((local_68._is_shared == false) && (local_68._data != (char *)0x0)) {
              operator_delete__(local_68._data);
            }
          }
          CImg(&local_68,"\\\\",2,1,1,1,false);
          uVar5 = local_48._0_8_ & 0xffffffff;
          pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
          move_to(&local_68,pCVar2->_data + uVar5);
        }
LAB_001a238b:
        if ((local_68._is_shared == false) && (local_68._data != (char *)0x0)) {
          operator_delete__(local_68._data);
        }
        values = pbVar4 + 1;
      }
LAB_001a23a5:
      pbVar4 = pbVar4 + 1;
      uVar5 = (ulong)(iVar9 + 1);
    } while (pbVar4 < pbVar8);
    pbVar4 = (byte *)local_38->_data;
    lVar7 = (ulong)local_38->_spectrum * (ulong)local_38->_depth *
            (ulong)local_38->_height * (ulong)local_38->_width;
    this = local_38;
  }
  if (values < pbVar4 + lVar7) {
    CImg(&local_68,(char *)values,(int)(pbVar4 + lVar7) - (int)values,1,1,1,false);
    uVar5 = local_48._0_8_ & 0xffffffff;
    pCVar2 = CImgList<char>::insert(&local_48,1,local_48._width);
    move_to(&local_68,pCVar2->_data + uVar5);
    if ((local_68._is_shared == false) && (local_68._data != (char *)0x0)) {
      operator_delete__(local_68._data);
    }
  }
  CImgList<char>::get_append(&local_68,&local_48,'x',0.0);
  pCVar3 = move_to(&local_68,this);
  if ((local_68._is_shared == false) && (local_68._data != (char *)0x0)) {
    operator_delete__(local_68._data);
  }
  CImgList<char>::~CImgList(&local_48);
  return pCVar3;
}

Assistant:

CImg<T>& _system_strescape() {
#define cimg_system_strescape(c,s) case c : if (p!=ptrs) CImg<T>(ptrs,(unsigned int)(p-ptrs),1,1,1,false).\
      move_to(list); \
      CImg<T>(s,(unsigned int)std::strlen(s),1,1,1,false).move_to(list); ptrs = p + 1; break
      CImgList<T> list;
      const T *ptrs = _data;
      cimg_for(*this,p,T) switch ((int)*p) {
        cimg_system_strescape('\\',"\\\\");
        cimg_system_strescape('\"',"\\\"");
        cimg_system_strescape('!',"\"\\!\"");
        cimg_system_strescape('`',"\\`");
        cimg_system_strescape('$',"\\$");
      }
      if (ptrs<end()) CImg<T>(ptrs,(unsigned int)(end()-ptrs),1,1,1,false).move_to(list);
      return (list>'x').move_to(*this);
    }